

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O3

flatcc_builder_ref_t
flatcc_builder_create_offset_vector(flatcc_builder_t *B,flatcc_builder_ref_t *vec,size_t count)

{
  int iVar1;
  flatcc_builder_ref_t fVar2;
  flatcc_builder_ref_t *__dest;
  
  iVar1 = flatcc_builder_start_offset_vector(B);
  if (iVar1 == 0) {
    __dest = flatcc_builder_extend_offset_vector(B,count);
    if (__dest != (flatcc_builder_ref_t *)0x0) {
      memcpy(__dest,vec,count << 2);
      fVar2 = flatcc_builder_end_offset_vector(B);
      return fVar2;
    }
  }
  return 0;
}

Assistant:

flatcc_builder_ref_t flatcc_builder_create_offset_vector(flatcc_builder_t *B,
        const flatcc_builder_ref_t *vec, size_t count)
{
    flatcc_builder_ref_t *_vec;

    if (flatcc_builder_start_offset_vector(B)) {
        return 0;
    }
    if (!(_vec = flatcc_builder_extend_offset_vector(B, count))) {
        return 0;
    }
    memcpy(_vec, vec, count * field_size);
    return flatcc_builder_end_offset_vector(B);
}